

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

void __thiscall duckdb::ZSTDScanState::ZSTDScanState(ZSTDScanState *this,ColumnSegment *segment)

{
  ulong uVar1;
  BlockHandle *pBVar2;
  BufferManager *pBVar3;
  ZSTD_DCtx *pZVar4;
  page_id_t *ppVar5;
  long lVar6;
  uncompressed_size_t *puVar7;
  BufferHandle local_40;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState = (_func_int **)&PTR__ZSTDScanState_024867e8
  ;
  local_40.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (segment->segment_state).
           super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
           .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_40);
  this->state = (UncompressedStringSegmentState *)
                local_40.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  this->block_manager = pBVar2->block_manager;
  pBVar3 = BufferManager::GetBufferManager(segment->db);
  this->buffer_manager = pBVar3;
  this->decompression_context = (ZSTD_DCtx *)0x0;
  this->segment_block_offset = segment->offset;
  BufferHandle::BufferHandle(&this->segment_handle);
  (this->current_vector).
  super_unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ZSTDVectorScanState_*,_std::default_delete<duckdb::ZSTDVectorScanState>_>
  .super__Head_base<0UL,_duckdb::ZSTDVectorScanState_*,_false>._M_head_impl =
       (ZSTDVectorScanState *)0x0;
  this->scanned_count = 0;
  AllocatedData::AllocatedData(&this->skip_buffer);
  pZVar4 = duckdb_zstd::ZSTD_createDCtx();
  this->decompression_context = pZVar4;
  (*this->buffer_manager->_vptr_BufferManager[7])(&local_40,this->buffer_manager,&segment->block);
  BufferHandle::operator=(&this->segment_handle,&local_40);
  BufferHandle::~BufferHandle(&local_40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->segment_handle).node);
  ppVar5 = (page_id_t *)(((this->segment_handle).node.ptr)->buffer + segment->offset);
  uVar1 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  this->segment_count = uVar1;
  lVar6 = ((uVar1 >> 0xb) + 1) - (ulong)((uVar1 & 0x7ff) == 0);
  this->page_ids = ppVar5;
  this->page_offsets = (page_offset_t *)(ppVar5 + lVar6);
  puVar7 = (uncompressed_size_t *)((lVar6 * 0xc + 7U & 0x7fffffffffffff8) + (long)ppVar5);
  this->uncompressed_sizes = puVar7;
  this->compressed_sizes = puVar7 + lVar6;
  this->scanned_count = 0;
  return;
}

Assistant:

explicit ZSTDScanState(ColumnSegment &segment)
	    : state(segment.GetSegmentState()->Cast<UncompressedStringSegmentState>()),
	      block_manager(segment.GetBlockManager()), buffer_manager(BufferManager::GetBufferManager(segment.db)),
	      segment_block_offset(segment.GetBlockOffset()) {
		decompression_context = duckdb_zstd::ZSTD_createDCtx();
		segment_handle = buffer_manager.Pin(segment.block);

		auto data = segment_handle.Ptr() + segment.GetBlockOffset();
		idx_t offset = 0;

		segment_count = segment.count.load();
		idx_t amount_of_vectors = (segment_count / ZSTD_VECTOR_SIZE) + ((segment_count % ZSTD_VECTOR_SIZE) != 0);

		// Set pointers to the Vector Metadata
		offset = AlignValue<idx_t, sizeof(page_id_t)>(offset);
		page_ids = reinterpret_cast<page_id_t *>(data + offset);
		offset += (sizeof(page_id_t) * amount_of_vectors);

		offset = AlignValue<idx_t, sizeof(page_offset_t)>(offset);
		page_offsets = reinterpret_cast<page_offset_t *>(data + offset);
		offset += (sizeof(page_offset_t) * amount_of_vectors);

		offset = AlignValue<idx_t, sizeof(uncompressed_size_t)>(offset);
		uncompressed_sizes = reinterpret_cast<uncompressed_size_t *>(data + offset);
		offset += (sizeof(uncompressed_size_t) * amount_of_vectors);

		offset = AlignValue<idx_t, sizeof(compressed_size_t)>(offset);
		compressed_sizes = reinterpret_cast<compressed_size_t *>(data + offset);
		offset += (sizeof(compressed_size_t) * amount_of_vectors);

		scanned_count = 0;
	}